

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O3

void tcmalloc::SaveProcSelfMapsToRawFD(RawFD fd)

{
  undefined1 local_2048 [8];
  RawFDGenericWriter<8192> writer;
  
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter.buf_end_ =
       writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.static_buffer_ + 0x1ff8;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter._vptr_GenericWriter =
       (_func_int **)0x0;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter.buf_ = (char *)0x0;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.super_GenericWriter.buf_fill_ =
       (char *)0x0;
  local_2048 = (undefined1  [8])&PTR__WriteFnWriter_001407c8;
  writer._8232_8_ = local_2048;
  writer.super_WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>.static_buffer_._8184_4_ = fd;
  DoForEachProcMapping
            (ForEachProcMapping<tcmalloc::SaveProcSelfMaps(tcmalloc::GenericWriter*)::$_0>(tcmalloc::SaveProcSelfMaps(tcmalloc::GenericWriter*)::$_0_const&)
             ::{lambda(tcmalloc::ProcMapping_const&,void*)#1}::ProcMapping_const__void__,
             &writer.super_RawFDWriteFn);
  WriteFnWriter<tcmalloc::RawFDWriteFn,_8192>::~WriteFnWriter
            ((WriteFnWriter<tcmalloc::RawFDWriteFn,_8192> *)local_2048);
  return;
}

Assistant:

void SaveProcSelfMapsToRawFD(RawFD fd) {
  RawFDGenericWriter<> writer(fd);
  SaveProcSelfMaps(&writer);
}